

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall ast::Sub::Sub(Sub *this,Token *t,int line)

{
  pointer pcVar1;
  undefined1 local_50 [16];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_50._0_8_ = &PTR__Token_001258b0;
  local_50._8_4_ = t->Type;
  pcVar1 = (t->Literal)._M_dataplus._M_p;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (t->Literal)._M_string_length);
  BinaryOp::BinaryOp(&this->super_BinaryOp,(Token *)local_50,2,0,line);
  local_50._0_8_ = &PTR__Token_001258b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  (this->super_BinaryOp).super_Op.super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR__BinaryOp_001252d0;
  return;
}

Assistant:

Sub(Token t, int line)
        :BinaryOp(t, PRECENDENCE::SUB, ASSOCIATION::LEFT, line) {}